

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::Stats::FinishedSingleOp(Stats *this)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  double value;
  undefined1 auVar5 [16];
  double dVar6;
  
  if (FLAGS_histogram) {
    uVar2 = (**(code **)(*(anonymous_namespace)::g_env + 0x98))();
    auVar5._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    value = dVar6 - this->last_op_finish_;
    Histogram::Add(&this->hist_,value);
    if (20000.0 < value) {
      fprintf(_stderr,"long op: %.1f micros%30s\r","");
      fflush(_stderr);
    }
    this->last_op_finish_ = dVar6;
  }
  uVar1 = this->next_report_;
  uVar4 = this->done_ + 1;
  this->done_ = uVar4;
  if ((int)uVar4 < (int)uVar1) {
    return;
  }
  if ((int)uVar1 < 1000) {
    iVar3 = 100;
  }
  else {
    iVar3 = 500;
    if ((((4999 < uVar1) && (iVar3 = 1000, 9999 < uVar1)) && (iVar3 = 5000, 49999 < uVar1)) &&
       ((iVar3 = 10000, 99999 < uVar1 && (iVar3 = 100000, uVar1 < 500000)))) {
      iVar3 = 50000;
    }
  }
  this->next_report_ = uVar1 + iVar3;
  fprintf(_stderr,"... finished %d ops%30s\r",(ulong)uVar4,"");
  fflush(_stderr);
  return;
}

Assistant:

void FinishedSingleOp() {
    if (FLAGS_histogram) {
      double now = g_env->NowMicros();
      double micros = now - last_op_finish_;
      hist_.Add(micros);
      if (micros > 20000) {
        fprintf(stderr, "long op: %.1f micros%30s\r", micros, "");
        fflush(stderr);
      }
      last_op_finish_ = now;
    }

    done_++;
    if (done_ >= next_report_) {
      if (next_report_ < 1000)
        next_report_ += 100;
      else if (next_report_ < 5000)
        next_report_ += 500;
      else if (next_report_ < 10000)
        next_report_ += 1000;
      else if (next_report_ < 50000)
        next_report_ += 5000;
      else if (next_report_ < 100000)
        next_report_ += 10000;
      else if (next_report_ < 500000)
        next_report_ += 50000;
      else
        next_report_ += 100000;
      fprintf(stderr, "... finished %d ops%30s\r", done_, "");
      fflush(stderr);
    }
  }